

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::genColorString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Vec4 *p)

{
  bool bVar1;
  char *__s;
  allocator<char> local_59;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  Vector<float,_4> local_28;
  
  local_28.m_data[0] = 1.0;
  local_28.m_data[1] = 1.0;
  local_28.m_data[2] = 1.0;
  local_28.m_data[3] = 1.0;
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 1.0;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 1.0;
  local_58.m_data[3] = 1.0;
  bVar1 = tcu::Vector<float,_4>::operator==((Vector<float,_4> *)this,&local_28);
  if (bVar1) {
    __s = "(white)";
  }
  else {
    bVar1 = tcu::Vector<float,_4>::operator==((Vector<float,_4> *)this,&local_38);
    if (bVar1) {
      __s = "(red)";
    }
    else {
      bVar1 = tcu::Vector<float,_4>::operator==((Vector<float,_4> *)this,&local_48);
      if (bVar1) {
        __s = "(yellow)";
      }
      else {
        bVar1 = tcu::Vector<float,_4>::operator==((Vector<float,_4> *)this,&local_58);
        if (bVar1) {
          __s = "(blue)";
        }
        else {
          __s = glcts::fixed_sample_locations_values + 1;
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_59)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string genColorString(const tcu::Vec4& p)
{
	const tcu::Vec4 white	(1.0f, 1.0f, 1.0f, 1.0f);
	const tcu::Vec4 red		(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue	(0.0f, 0.0f, 1.0f, 1.0f);

	if (p == white)		return "(white)";
	if (p == red)		return "(red)";
	if (p == yellow)	return "(yellow)";
	if (p == blue)		return "(blue)";
	return "";
}